

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketConnection::ThreadedSocketConnection
          (ThreadedSocketConnection *this,socket_handle s,Sessions *sessions,Log *pLog)

{
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__ThreadedSocketConnection_001fa750;
  this->m_socket = s;
  (this->m_address)._M_dataplus._M_p = (pointer)&(this->m_address).field_2;
  (this->m_address)._M_string_length = 0;
  (this->m_address).field_2._M_local_buf[0] = '\0';
  (this->m_sourceAddress)._M_dataplus._M_p = (pointer)&(this->m_sourceAddress).field_2;
  (this->m_sourceAddress)._M_string_length = 0;
  (this->m_sourceAddress).field_2._M_local_buf[0] = '\0';
  this->m_pLog = pLog;
  (this->m_parser).m_buffer._M_dataplus._M_p = (pointer)&(this->m_parser).m_buffer.field_2;
  (this->m_parser).m_buffer._M_string_length = 0;
  (this->m_parser).m_buffer.field_2._M_local_buf[0] = '\0';
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&(this->m_sessions)._M_t,&sessions->_M_t);
  this->m_pSession = (Session *)0x0;
  this->m_disconnect = false;
  return;
}

Assistant:

ThreadedSocketConnection::ThreadedSocketConnection(socket_handle s, Sessions sessions, Log *pLog)
    : m_socket(s),
      m_pLog(pLog),
      m_sessions(sessions),
      m_pSession(0),
      m_disconnect(false) {
#if _MSC_VER
  FD_ZERO(&m_fds);
  FD_SET(m_socket, &m_fds);
#endif
}